

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_texture_npatch
               (rf_texture2d texture,rf_npatch_info n_patch_info,rf_rec dest_rec,rf_vec2 origin,
               float rotation,rf_color tint)

{
  bool bVar1;
  bool bVar2;
  rf_npatch_info rVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float y;
  float x;
  float y_00;
  float x_00;
  float y_01;
  float x_01;
  float y_02;
  float local_a8;
  float local_a4;
  rf_vec2 coord_d;
  rf_vec2 coord_c;
  rf_vec2 coord_b;
  rf_vec2 coord_a;
  rf_vec2 vert_d;
  rf_vec2 vert_c;
  rf_vec2 vert_b;
  rf_vec2 vert_a;
  float bottom_border;
  float right_border;
  float top_border;
  float left_border;
  _Bool draw_middle;
  float fStack_34;
  _Bool draw_center;
  float patch_height;
  float patch_width;
  float height;
  float width;
  float rotation_local;
  rf_color tint_local;
  rf_vec2 origin_local;
  rf_rec dest_rec_local;
  
  if (texture.id != 0) {
    fVar4 = (float)texture.width;
    fVar5 = (float)texture.height;
    dest_rec_local.x = dest_rec.width;
    if (0.0 < dest_rec_local.x) {
      local_a4 = dest_rec_local.x;
    }
    else {
      local_a4 = 0.0;
    }
    fStack_34 = local_a4;
    dest_rec_local.y = dest_rec.height;
    if (0.0 < dest_rec_local.y) {
      local_a8 = dest_rec_local.y;
    }
    else {
      local_a8 = 0.0;
    }
    left_border = local_a8;
    if (n_patch_info.source_rec.width < 0.0) {
      n_patch_info.source_rec.x = n_patch_info.source_rec.x - n_patch_info.source_rec.width;
    }
    rVar3 = n_patch_info;
    if (n_patch_info.source_rec.height < 0.0) {
      fVar6 = n_patch_info.source_rec.y - n_patch_info.source_rec.height;
      n_patch_info.source_rec.y = fVar6;
    }
    if (n_patch_info.type == 2) {
      left_border = n_patch_info.source_rec.height;
    }
    if (n_patch_info.type == 1) {
      fStack_34 = n_patch_info.source_rec.width;
    }
    bVar1 = true;
    bVar2 = true;
    right_border = (float)n_patch_info.left;
    bottom_border = (float)n_patch_info.top;
    vert_a.y = (float)n_patch_info.right;
    vert_a.x = (float)n_patch_info.bottom;
    if ((fStack_34 <= right_border + vert_a.y) && (n_patch_info.type != 1)) {
      bVar1 = false;
      right_border = (right_border / (right_border + vert_a.y)) * fStack_34;
      vert_a.y = fStack_34 - right_border;
    }
    if ((left_border <= bottom_border + vert_a.x) && (n_patch_info.type != 2)) {
      bVar2 = false;
      bottom_border = (bottom_border / (bottom_border + vert_a.x)) * left_border;
      vert_a.x = left_border - bottom_border;
    }
    fVar6 = fStack_34 - vert_a.y;
    y = left_border - vert_a.x;
    x = n_patch_info.source_rec.x / fVar4;
    y_00 = n_patch_info.source_rec.y / fVar5;
    x_00 = (n_patch_info.source_rec.x + right_border) / fVar4;
    y_01 = (n_patch_info.source_rec.y + bottom_border) / fVar5;
    x_01 = ((n_patch_info.source_rec.x + n_patch_info.source_rec.width) - vert_a.y) / fVar4;
    y_02 = ((n_patch_info.source_rec.y + n_patch_info.source_rec.height) - vert_a.x) / fVar5;
    fVar4 = (n_patch_info.source_rec.x + n_patch_info.source_rec.width) / fVar4;
    fVar5 = (n_patch_info.source_rec.y + n_patch_info.source_rec.height) / fVar5;
    rf_gfx_enable_texture(texture.id);
    rf_gfx_push_matrix();
    origin_local.x = dest_rec.x;
    origin_local.y = dest_rec.y;
    rf_gfx_translatef(origin_local.x,origin_local.y,0.0);
    rf_gfx_rotatef(rotation,0.0,0.0,1.0);
    rotation_local = origin.x;
    tint_local = (rf_color)origin.y;
    rf_gfx_translatef(-rotation_local,-(float)tint_local,0.0);
    rf_gfx_begin(RF_QUADS);
    width._0_1_ = tint.r;
    width._1_1_ = tint.g;
    width._2_1_ = tint.b;
    width._3_1_ = tint.a;
    rf_gfx_color4ub(width._0_1_,width._1_1_,width._2_1_,width._3_1_);
    rf_gfx_normal3f(0.0,0.0,1.0);
    n_patch_info.type = rVar3.type;
    if (n_patch_info.type == 0) {
      rf_gfx_tex_coord2f(x,y_01);
      rf_gfx_vertex2f(0.0,bottom_border);
      rf_gfx_tex_coord2f(x_00,y_01);
      rf_gfx_vertex2f(right_border,bottom_border);
      rf_gfx_tex_coord2f(x_00,y_00);
      rf_gfx_vertex2f(right_border,0.0);
      rf_gfx_tex_coord2f(x,y_00);
      rf_gfx_vertex2f(0.0,0.0);
      if (bVar1) {
        rf_gfx_tex_coord2f(x_00,y_01);
        rf_gfx_vertex2f(right_border,bottom_border);
        rf_gfx_tex_coord2f(x_01,y_01);
        rf_gfx_vertex2f(fVar6,bottom_border);
        rf_gfx_tex_coord2f(x_01,y_00);
        rf_gfx_vertex2f(fVar6,0.0);
        rf_gfx_tex_coord2f(x_00,y_00);
        rf_gfx_vertex2f(right_border,0.0);
      }
      rf_gfx_tex_coord2f(x_01,y_01);
      rf_gfx_vertex2f(fVar6,bottom_border);
      rf_gfx_tex_coord2f(fVar4,y_01);
      rf_gfx_vertex2f(fStack_34,bottom_border);
      rf_gfx_tex_coord2f(fVar4,y_00);
      rf_gfx_vertex2f(fStack_34,0.0);
      rf_gfx_tex_coord2f(x_01,y_00);
      rf_gfx_vertex2f(fVar6,0.0);
      if (bVar2) {
        rf_gfx_tex_coord2f(x,y_02);
        rf_gfx_vertex2f(0.0,y);
        rf_gfx_tex_coord2f(x_00,y_02);
        rf_gfx_vertex2f(right_border,y);
        rf_gfx_tex_coord2f(x_00,y_01);
        rf_gfx_vertex2f(right_border,bottom_border);
        rf_gfx_tex_coord2f(x,y_01);
        rf_gfx_vertex2f(0.0,bottom_border);
        if (bVar1) {
          rf_gfx_tex_coord2f(x_00,y_02);
          rf_gfx_vertex2f(right_border,y);
          rf_gfx_tex_coord2f(x_01,y_02);
          rf_gfx_vertex2f(fVar6,y);
          rf_gfx_tex_coord2f(x_01,y_01);
          rf_gfx_vertex2f(fVar6,bottom_border);
          rf_gfx_tex_coord2f(x_00,y_01);
          rf_gfx_vertex2f(right_border,bottom_border);
        }
        rf_gfx_tex_coord2f(x_01,y_02);
        rf_gfx_vertex2f(fVar6,y);
        rf_gfx_tex_coord2f(fVar4,y_02);
        rf_gfx_vertex2f(fStack_34,y);
        rf_gfx_tex_coord2f(fVar4,y_01);
        rf_gfx_vertex2f(fStack_34,bottom_border);
        rf_gfx_tex_coord2f(x_01,y_01);
        rf_gfx_vertex2f(fVar6,bottom_border);
      }
      rf_gfx_tex_coord2f(x,fVar5);
      rf_gfx_vertex2f(0.0,left_border);
      rf_gfx_tex_coord2f(x_00,fVar5);
      rf_gfx_vertex2f(right_border,left_border);
      rf_gfx_tex_coord2f(x_00,y_02);
      rf_gfx_vertex2f(right_border,y);
      rf_gfx_tex_coord2f(x,y_02);
      rf_gfx_vertex2f(0.0,y);
      if (bVar1) {
        rf_gfx_tex_coord2f(x_00,fVar5);
        rf_gfx_vertex2f(right_border,left_border);
        rf_gfx_tex_coord2f(x_01,fVar5);
        rf_gfx_vertex2f(fVar6,left_border);
        rf_gfx_tex_coord2f(x_01,y_02);
        rf_gfx_vertex2f(fVar6,y);
        rf_gfx_tex_coord2f(x_00,y_02);
        rf_gfx_vertex2f(right_border,y);
      }
      rf_gfx_tex_coord2f(x_01,fVar5);
      rf_gfx_vertex2f(fVar6,left_border);
      rf_gfx_tex_coord2f(fVar4,fVar5);
      rf_gfx_vertex2f(fStack_34,left_border);
      rf_gfx_tex_coord2f(fVar4,y_02);
      rf_gfx_vertex2f(fStack_34,y);
      rf_gfx_tex_coord2f(x_01,y_02);
      rf_gfx_vertex2f(fVar6,y);
    }
    else if (n_patch_info.type == 1) {
      rf_gfx_tex_coord2f(x,y_01);
      rf_gfx_vertex2f(0.0,bottom_border);
      rf_gfx_tex_coord2f(fVar4,y_01);
      rf_gfx_vertex2f(fStack_34,bottom_border);
      rf_gfx_tex_coord2f(fVar4,y_00);
      rf_gfx_vertex2f(fStack_34,0.0);
      rf_gfx_tex_coord2f(x,y_00);
      rf_gfx_vertex2f(0.0,0.0);
      if (bVar1) {
        rf_gfx_tex_coord2f(x,y_02);
        rf_gfx_vertex2f(0.0,y);
        rf_gfx_tex_coord2f(fVar4,y_02);
        rf_gfx_vertex2f(fStack_34,y);
        rf_gfx_tex_coord2f(fVar4,y_01);
        rf_gfx_vertex2f(fStack_34,bottom_border);
        rf_gfx_tex_coord2f(x,y_01);
        rf_gfx_vertex2f(0.0,bottom_border);
      }
      rf_gfx_tex_coord2f(x,fVar5);
      rf_gfx_vertex2f(0.0,left_border);
      rf_gfx_tex_coord2f(fVar4,fVar5);
      rf_gfx_vertex2f(fStack_34,left_border);
      rf_gfx_tex_coord2f(fVar4,y_02);
      rf_gfx_vertex2f(fStack_34,y);
      rf_gfx_tex_coord2f(x,y_02);
      rf_gfx_vertex2f(0.0,y);
    }
    else if (n_patch_info.type == 2) {
      rf_gfx_tex_coord2f(x,fVar5);
      rf_gfx_vertex2f(0.0,left_border);
      rf_gfx_tex_coord2f(x_00,fVar5);
      rf_gfx_vertex2f(right_border,left_border);
      rf_gfx_tex_coord2f(x_00,y_00);
      rf_gfx_vertex2f(right_border,0.0);
      rf_gfx_tex_coord2f(x,y_00);
      rf_gfx_vertex2f(0.0,0.0);
      if (bVar1) {
        rf_gfx_tex_coord2f(x_00,fVar5);
        rf_gfx_vertex2f(right_border,left_border);
        rf_gfx_tex_coord2f(x_01,fVar5);
        rf_gfx_vertex2f(fVar6,left_border);
        rf_gfx_tex_coord2f(x_01,y_00);
        rf_gfx_vertex2f(fVar6,0.0);
        rf_gfx_tex_coord2f(x_00,y_00);
        rf_gfx_vertex2f(right_border,0.0);
      }
      rf_gfx_tex_coord2f(x_01,fVar5);
      rf_gfx_vertex2f(fVar6,left_border);
      rf_gfx_tex_coord2f(fVar4,fVar5);
      rf_gfx_vertex2f(fStack_34,left_border);
      rf_gfx_tex_coord2f(fVar4,y_00);
      rf_gfx_vertex2f(fStack_34,0.0);
      rf_gfx_tex_coord2f(x_01,y_00);
      rf_gfx_vertex2f(fVar6,0.0);
    }
    rf_gfx_end();
    rf_gfx_pop_matrix();
    rf_gfx_disable_texture();
  }
  return;
}

Assistant:

RF_API void rf_draw_texture_npatch(rf_texture2d texture, rf_npatch_info n_patch_info, rf_rec dest_rec, rf_vec2 origin, float rotation, rf_color tint)
{
    if (texture.id > 0)
    {
        float width = (float)texture.width;
        float height = (float)texture.height;

        float patch_width = (dest_rec.width <= 0.0f)? 0.0f : dest_rec.width;
        float patch_height = (dest_rec.height <= 0.0f)? 0.0f : dest_rec.height;

        if (n_patch_info.source_rec.width < 0) n_patch_info.source_rec.x -= n_patch_info.source_rec.width;
        if (n_patch_info.source_rec.height < 0) n_patch_info.source_rec.y -= n_patch_info.source_rec.height;
        if (n_patch_info.type == RF_NPT_3PATCH_HORIZONTAL) patch_height = n_patch_info.source_rec.height;
        if (n_patch_info.type == RF_NPT_3PATCH_VERTICAL) patch_width = n_patch_info.source_rec.width;

        bool draw_center = true;
        bool draw_middle = true;
        float left_border = (float)n_patch_info.left;
        float top_border = (float)n_patch_info.top;
        float right_border = (float)n_patch_info.right;
        float bottom_border = (float)n_patch_info.bottom;

        // adjust the lateral (left and right) border widths in case patch_width < texture.width
        if (patch_width <= (left_border + right_border) && n_patch_info.type != RF_NPT_3PATCH_VERTICAL)
        {
            draw_center = false;
            left_border = (left_border / (left_border + right_border)) * patch_width;
            right_border = patch_width - left_border;
        }
        // adjust the lateral (top and bottom) border heights in case patch_height < texture.height
        if (patch_height <= (top_border + bottom_border) && n_patch_info.type != RF_NPT_3PATCH_HORIZONTAL)
        {
            draw_middle = false;
            top_border = (top_border / (top_border + bottom_border)) * patch_height;
            bottom_border = patch_height - top_border;
        }

        rf_vec2 vert_a, vert_b, vert_c, vert_d;
        vert_a.x = 0.0f; // outer left
        vert_a.y = 0.0f; // outer top
        vert_b.x = left_border; // inner left
        vert_b.y = top_border; // inner top
        vert_c.x = patch_width - right_border; // inner right
        vert_c.y = patch_height - bottom_border; // inner bottom
        vert_d.x = patch_width; // outer right
        vert_d.y = patch_height; // outer bottom

        rf_vec2 coord_a, coord_b, coord_c, coord_d;
        coord_a.x = n_patch_info.source_rec.x / width;
        coord_a.y = n_patch_info.source_rec.y / height;
        coord_b.x = (n_patch_info.source_rec.x + left_border) / width;
        coord_b.y = (n_patch_info.source_rec.y + top_border) / height;
        coord_c.x = (n_patch_info.source_rec.x + n_patch_info.source_rec.width - right_border) / width;
        coord_c.y = (n_patch_info.source_rec.y + n_patch_info.source_rec.height - bottom_border) / height;
        coord_d.x = (n_patch_info.source_rec.x + n_patch_info.source_rec.width) / width;
        coord_d.y = (n_patch_info.source_rec.y + n_patch_info.source_rec.height) / height;

        rf_gfx_enable_texture(texture.id);

        rf_gfx_push_matrix();
        rf_gfx_translatef(dest_rec.x, dest_rec.y, 0.0f);
        rf_gfx_rotatef(rotation, 0.0f, 0.0f, 1.0f);
        rf_gfx_translatef(-origin.x, -origin.y, 0.0f);

        rf_gfx_begin(RF_QUADS);
        rf_gfx_color4ub(tint.r, tint.g, tint.b, tint.a);
        rf_gfx_normal3f(0.0f, 0.0f, 1.0f); // Normal vector pointing towards viewer

        if (n_patch_info.type == RF_NPT_9PATCH)
        {
            // ------------------------------------------------------------
            // TOP-LEFT QUAD
            rf_gfx_tex_coord2f(coord_a.x, coord_b.y); rf_gfx_vertex2f(vert_a.x, vert_b.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_b.y); rf_gfx_vertex2f(vert_b.x, vert_b.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_a.y); rf_gfx_vertex2f(vert_b.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_a.y); rf_gfx_vertex2f(vert_a.x, vert_a.y); // Top-left corner for texture and quad
            if (draw_center)
            {
                // TOP-CENTER QUAD
                rf_gfx_tex_coord2f(coord_b.x, coord_b.y); rf_gfx_vertex2f(vert_b.x, vert_b.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_b.y); rf_gfx_vertex2f(vert_c.x, vert_b.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_a.y); rf_gfx_vertex2f(vert_c.x, vert_a.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_a.y); rf_gfx_vertex2f(vert_b.x, vert_a.y); // Top-left corner for texture and quad
            }
            // TOP-RIGHT QUAD
            rf_gfx_tex_coord2f(coord_c.x, coord_b.y); rf_gfx_vertex2f(vert_c.x, vert_b.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_b.y); rf_gfx_vertex2f(vert_d.x, vert_b.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_a.y); rf_gfx_vertex2f(vert_d.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_c.x, coord_a.y); rf_gfx_vertex2f(vert_c.x, vert_a.y); // Top-left corner for texture and quad
            if (draw_middle)
            {
                // ------------------------------------------------------------
                // MIDDLE-LEFT QUAD
                rf_gfx_tex_coord2f(coord_a.x, coord_c.y); rf_gfx_vertex2f(vert_a.x, vert_c.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_c.y); rf_gfx_vertex2f(vert_b.x, vert_c.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_b.y); rf_gfx_vertex2f(vert_b.x, vert_b.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_a.x, coord_b.y); rf_gfx_vertex2f(vert_a.x, vert_b.y); // Top-left corner for texture and quad
                if (draw_center)
                {
                    // MIDDLE-CENTER QUAD
                    rf_gfx_tex_coord2f(coord_b.x, coord_c.y); rf_gfx_vertex2f(vert_b.x, vert_c.y); // Bottom-left corner for texture and quad
                    rf_gfx_tex_coord2f(coord_c.x, coord_c.y); rf_gfx_vertex2f(vert_c.x, vert_c.y); // Bottom-right corner for texture and quad
                    rf_gfx_tex_coord2f(coord_c.x, coord_b.y); rf_gfx_vertex2f(vert_c.x, vert_b.y); // Top-right corner for texture and quad
                    rf_gfx_tex_coord2f(coord_b.x, coord_b.y); rf_gfx_vertex2f(vert_b.x, vert_b.y); // Top-left corner for texture and quad
                }

                // MIDDLE-RIGHT QUAD
                rf_gfx_tex_coord2f(coord_c.x, coord_c.y); rf_gfx_vertex2f(vert_c.x, vert_c.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_d.x, coord_c.y); rf_gfx_vertex2f(vert_d.x, vert_c.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_d.x, coord_b.y); rf_gfx_vertex2f(vert_d.x, vert_b.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_b.y); rf_gfx_vertex2f(vert_c.x, vert_b.y); // Top-left corner for texture and quad
            }

            // ------------------------------------------------------------
            // BOTTOM-LEFT QUAD
            rf_gfx_tex_coord2f(coord_a.x, coord_d.y); rf_gfx_vertex2f(vert_a.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_d.y); rf_gfx_vertex2f(vert_b.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_c.y); rf_gfx_vertex2f(vert_b.x, vert_c.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_c.y); rf_gfx_vertex2f(vert_a.x, vert_c.y); // Top-left corner for texture and quad
            if (draw_center)
            {
                // BOTTOM-CENTER QUAD
                rf_gfx_tex_coord2f(coord_b.x, coord_d.y); rf_gfx_vertex2f(vert_b.x, vert_d.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_d.y); rf_gfx_vertex2f(vert_c.x, vert_d.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_c.y); rf_gfx_vertex2f(vert_c.x, vert_c.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_c.y); rf_gfx_vertex2f(vert_b.x, vert_c.y); // Top-left corner for texture and quad
            }

            // BOTTOM-RIGHT QUAD
            rf_gfx_tex_coord2f(coord_c.x, coord_d.y); rf_gfx_vertex2f(vert_c.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_d.y); rf_gfx_vertex2f(vert_d.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_c.y); rf_gfx_vertex2f(vert_d.x, vert_c.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_c.x, coord_c.y); rf_gfx_vertex2f(vert_c.x, vert_c.y); // Top-left corner for texture and quad
        }
        else if (n_patch_info.type == RF_NPT_3PATCH_VERTICAL)
        {
            // TOP QUAD
            // -----------------------------------------------------------
            // rf_texture coords                 Vertices
            rf_gfx_tex_coord2f(coord_a.x, coord_b.y); rf_gfx_vertex2f(vert_a.x, vert_b.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_b.y); rf_gfx_vertex2f(vert_d.x, vert_b.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_a.y); rf_gfx_vertex2f(vert_d.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_a.y); rf_gfx_vertex2f(vert_a.x, vert_a.y); // Top-left corner for texture and quad
            if (draw_center)
            {
                // MIDDLE QUAD
                // -----------------------------------------------------------
                // rf_texture coords                 Vertices
                rf_gfx_tex_coord2f(coord_a.x, coord_c.y); rf_gfx_vertex2f(vert_a.x, vert_c.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_d.x, coord_c.y); rf_gfx_vertex2f(vert_d.x, vert_c.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_d.x, coord_b.y); rf_gfx_vertex2f(vert_d.x, vert_b.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_a.x, coord_b.y); rf_gfx_vertex2f(vert_a.x, vert_b.y); // Top-left corner for texture and quad
            }
            // BOTTOM QUAD
            // -----------------------------------------------------------
            // rf_texture coords                 Vertices
            rf_gfx_tex_coord2f(coord_a.x, coord_d.y); rf_gfx_vertex2f(vert_a.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_d.y); rf_gfx_vertex2f(vert_d.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_c.y); rf_gfx_vertex2f(vert_d.x, vert_c.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_c.y); rf_gfx_vertex2f(vert_a.x, vert_c.y); // Top-left corner for texture and quad
        }
        else if (n_patch_info.type == RF_NPT_3PATCH_HORIZONTAL)
        {
            // LEFT QUAD
            // -----------------------------------------------------------
            // rf_texture coords                 Vertices
            rf_gfx_tex_coord2f(coord_a.x, coord_d.y); rf_gfx_vertex2f(vert_a.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_d.y); rf_gfx_vertex2f(vert_b.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_a.y); rf_gfx_vertex2f(vert_b.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_a.y); rf_gfx_vertex2f(vert_a.x, vert_a.y); // Top-left corner for texture and quad
            if (draw_center)
            {
                // CENTER QUAD
                // -----------------------------------------------------------
                // rf_texture coords                 Vertices
                rf_gfx_tex_coord2f(coord_b.x, coord_d.y); rf_gfx_vertex2f(vert_b.x, vert_d.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_d.y); rf_gfx_vertex2f(vert_c.x, vert_d.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_a.y); rf_gfx_vertex2f(vert_c.x, vert_a.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_a.y); rf_gfx_vertex2f(vert_b.x, vert_a.y); // Top-left corner for texture and quad
            }
            // RIGHT QUAD
            // -----------------------------------------------------------
            // rf_texture coords                 Vertices
            rf_gfx_tex_coord2f(coord_c.x, coord_d.y); rf_gfx_vertex2f(vert_c.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_d.y); rf_gfx_vertex2f(vert_d.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_a.y); rf_gfx_vertex2f(vert_d.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_c.x, coord_a.y); rf_gfx_vertex2f(vert_c.x, vert_a.y); // Top-left corner for texture and quad
        }
        rf_gfx_end();
        rf_gfx_pop_matrix();

        rf_gfx_disable_texture();

    }
}